

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O3

bool __thiscall
ReplayInterface::enqueue_create_render_pass
          (ReplayInterface *this,Hash hash,VkRenderPassCreateInfo *create_info,
          VkRenderPass *render_pass)

{
  bool bVar1;
  bool bVar2;
  Hash in_RAX;
  Hash recorded_hash;
  Hash local_28;
  
  local_28 = in_RAX;
  bVar1 = Fossilize::Hashing::compute_hash_render_pass(create_info,&local_28);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, local_28 == hash)) {
    *render_pass = (VkRenderPass)hash;
    bVar2 = Fossilize::StateRecorder::record_render_pass
                      (&this->recorder,(VkRenderPass)hash,create_info,0);
  }
  return bVar2;
}

Assistant:

bool enqueue_create_render_pass(Hash hash, const VkRenderPassCreateInfo *create_info, VkRenderPass *render_pass) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_render_pass(*create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*render_pass = fake_handle<VkRenderPass>(hash);
		return recorder.record_render_pass(*render_pass, *create_info);
	}